

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.hpp
# Opt level: O0

Vector2<float> __thiscall
eos::render::clip_to_screen_space<float>
          (render *this,float clip_coord_x,float clip_coord_y,int screen_width,int screen_height)

{
  PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> extraout_XMM0_Qa;
  float local_28;
  float local_24;
  float y_ss;
  float x_ss;
  int screen_height_local;
  int screen_width_local;
  float clip_coord_y_local;
  float clip_coord_x_local;
  
  local_24 = (clip_coord_x + 1.0) * ((float)screen_width / 2.0);
  local_28 = -(clip_coord_y + 1.0) * ((float)screen_height / 2.0) + (float)screen_height;
  y_ss = (float)screen_height;
  x_ss = (float)screen_width;
  screen_height_local = (int)clip_coord_y;
  screen_width_local = (int)clip_coord_x;
  _clip_coord_y_local = this;
  Eigen::Matrix<float,2,1,0,2,1>::Matrix<float,float>
            ((Matrix<float,2,1,0,2,1> *)this,&local_24,&local_28);
  return (PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>)
         (PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>)
         extraout_XMM0_Qa.m_storage.m_data.array;
}

Assistant:

Eigen::Vector2<T> clip_to_screen_space(const T clip_coord_x, const T clip_coord_y, int screen_width,
                                       int screen_height)
{
    // Window transform:
    const T x_ss = (clip_coord_x + T(1)) * (screen_width / 2.0);
    const T y_ss =
        screen_height - (clip_coord_y + T(1)) *
                            (screen_height / 2.0); // also flip y; Qt: Origin top-left. OpenGL: bottom-left.
    return Eigen::Vector2<T>(x_ss, y_ss);
}